

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O3

void __thiscall ParialSphere_Normal_Test::TestBody(ParialSphere_Normal_Test *this)

{
  long lVar1;
  ulong uVar2;
  float fVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  int c_1;
  float *pfVar10;
  byte bVar11;
  ulong uVar12;
  uint uVar13;
  uint64_t oldstate;
  char *message;
  int c;
  int iVar14;
  long lVar15;
  float fVar16;
  Float zMin;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_ZMM7 [64];
  undefined1 in_XMM9 [16];
  AssertionResult gtest_ar;
  Bounds3f bbox;
  Sphere sphere;
  optional<pbrt::ShapeIntersection> si;
  Transform identity;
  float local_278 [4];
  float local_268;
  float local_264;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  internal local_258 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  long local_248;
  AssertHelper local_240;
  Ray local_238;
  Bounds3f local_210;
  undefined1 local_1f8 [16];
  Sphere local_1e8;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_1b8;
  char local_b8;
  Transform local_b0;
  undefined1 extraout_var [56];
  
  lVar15 = 0;
  do {
    lVar1 = lVar15 * 2 + 1;
    uVar12 = ((ulong)(lVar15 * 0x7fb5d329728ea185) >> 0x1b ^ lVar15 * 0x7fb5d329728ea185) *
             -0x7e25210b43d22bb3;
    pbrt::Transform::Transform(&local_b0);
    uVar12 = ((uVar12 >> 0x21 ^ uVar12) + 1) * 0x5851f42d4c957f2d + lVar15 * -0x4f5c17a566d501a4 + 1
    ;
    uVar2 = uVar12 * 0x5851f42d4c957f2d + 1 + lVar15 * 2;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar12;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar2;
    auVar21 = vpunpcklqdq_avx(auVar25,auVar19);
    auVar17 = vpsrlvq_avx2(auVar21,_DAT_006015b0);
    auVar19 = vpsrlvq_avx2(auVar21,_DAT_006015a0);
    auVar21 = vpsrlq_avx(auVar21,0x3b);
    auVar21 = vpshufd_avx(auVar21,0xe8);
    auVar17 = vpshufd_avx(auVar19 ^ auVar17,0xe8);
    auVar21 = vprorvd_avx512vl(auVar17,auVar21);
    auVar17 = vcvtudq2ps_avx512vl(auVar21);
    auVar21._8_4_ = 0x2f800000;
    auVar21._0_8_ = 0x2f8000002f800000;
    auVar21._12_4_ = 0x2f800000;
    local_1f8 = vmulps_avx512vl(auVar17,auVar21);
    auVar17._8_4_ = 0x3f7fffff;
    auVar17._0_8_ = 0x3f7fffff3f7fffff;
    auVar17._12_4_ = 0x3f7fffff;
    uVar4 = vcmpps_avx512vl(local_1f8,auVar17,1);
    auVar21 = vmovshdup_avx(local_1f8);
    bVar11 = (byte)(uVar4 >> 1);
    fVar16 = (float)((uint)(bVar11 & 1) * auVar21._0_4_ + (uint)!(bool)(bVar11 & 1) * 0x3f7fffff);
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * 4.0)),ZEXT416((uint)(1.0 - fVar16)),
                              ZEXT416(0xc0800000));
    auVar24._0_8_ = pow(10.0,(double)auVar21._0_4_);
    auVar24._8_56_ = extraout_var;
    auVar18._0_4_ = (float)auVar24._0_8_;
    auVar18._4_12_ = auVar24._4_12_;
    uVar12 = uVar2 * 0x5851f42d4c957f2d + 1 + lVar15 * 2;
    auVar21 = in_ZMM7._0_16_;
    if (((uVar4 & 1) == 0) || (0.5 <= (float)local_1f8._0_4_)) {
      uVar13 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
      bVar11 = (byte)(uVar12 >> 0x3b);
      auVar17 = vcvtusi2ss_avx512f(auVar21,uVar13 >> bVar11 | uVar13 << 0x20 - bVar11);
      uVar12 = uVar12 * 0x5851f42d4c957f2d + lVar1;
      auVar17 = vminss_avx(ZEXT416((uint)(auVar17._0_4_ * 2.3283064e-10)),
                           SUB6416(ZEXT464(0x3f7fffff),0));
      auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ * auVar18._0_4_)),auVar18,
                                 ZEXT416((uint)(1.0 - auVar17._0_4_)));
      zMin = auVar17._0_4_;
    }
    else {
      auVar5._8_4_ = 0x80000000;
      auVar5._0_8_ = 0x8000000080000000;
      auVar5._12_4_ = 0x80000000;
      auVar17 = vxorps_avx512vl(auVar18,auVar5);
      zMin = auVar17._0_4_;
    }
    uVar13 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
    bVar11 = (byte)(uVar12 >> 0x3b);
    auVar17 = vcvtusi2ss_avx512f(auVar21,uVar13 >> bVar11 | uVar13 << 0x20 - bVar11);
    uVar12 = uVar12 * 0x5851f42d4c957f2d + lVar1;
    auVar25 = SUB6416(ZEXT464(0x3f7fffff),0);
    auVar17 = vminss_avx(ZEXT416((uint)(auVar17._0_4_ * 2.3283064e-10)),auVar25);
    auVar19 = auVar18;
    if (0.5 <= auVar17._0_4_) {
      uVar13 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
      bVar11 = (byte)(uVar12 >> 0x3b);
      auVar17 = vcvtusi2ss_avx512f(auVar21,uVar13 >> bVar11 | uVar13 << 0x20 - bVar11);
      uVar12 = uVar12 * 0x5851f42d4c957f2d + lVar1;
      auVar17 = vminss_avx(ZEXT416((uint)(auVar17._0_4_ * 2.3283064e-10)),auVar25);
      auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ * auVar18._0_4_)),auVar18,
                                 ZEXT416((uint)(1.0 - auVar17._0_4_)));
    }
    uVar13 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
    bVar11 = (byte)(uVar12 >> 0x3b);
    auVar17 = vcvtusi2ss_avx512f(auVar21,uVar13 >> bVar11 | uVar13 << 0x20 - bVar11);
    uVar12 = uVar12 * 0x5851f42d4c957f2d + lVar1;
    auVar17 = vminss_avx(ZEXT416((uint)(auVar17._0_4_ * 2.3283064e-10)),auVar25);
    if (0.5 <= auVar17._0_4_) {
      uVar13 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
      bVar11 = (byte)(uVar12 >> 0x3b);
      auVar21 = vcvtusi2ss_avx512f(auVar21,uVar13 >> bVar11 | uVar13 << 0x20 - bVar11);
      uVar12 = uVar12 * 0x5851f42d4c957f2d + lVar1;
      auVar21 = vminss_avx(ZEXT416((uint)(auVar21._0_4_ * 2.3283064e-10)),auVar25);
      fVar16 = auVar21._0_4_ * 360.0;
    }
    else {
      fVar16 = 360.0;
    }
    iVar14 = 0;
    local_248 = lVar15;
    pbrt::Sphere::Sphere
              (&local_1e8,&local_b0,&local_b0,false,auVar18._0_4_,zMin,auVar19._0_4_,fVar16);
    local_264 = 0.0;
    local_268 = 0.0;
    local_278[3] = 0.0;
    do {
      uVar13 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
      bVar11 = (byte)(uVar12 >> 0x3b);
      auVar21 = vcvtusi2ss_avx512f(in_ZMM7._0_16_,uVar13 >> bVar11 | uVar13 << 0x20 - bVar11);
      auVar21 = vminss_avx(ZEXT416((uint)(auVar21._0_4_ * 2.3283064e-10)),
                           SUB6416(ZEXT464(0x3f7fffff),0));
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * 8.0)),
                                ZEXT416((uint)(1.0 - auVar21._0_4_)),ZEXT416(0xc1000000));
      dVar20 = pow(10.0,(double)auVar21._0_4_);
      pfVar10 = (float *)((long)local_278 + 0x14);
      if (iVar14 != 0) {
        if (iVar14 == 1) {
          pfVar10 = (float *)((long)local_278 + 0x10);
        }
        else {
          pfVar10 = (float *)((long)local_278 + 0xc);
        }
      }
      iVar14 = iVar14 + 1;
      uVar12 = uVar12 * 0x5851f42d4c957f2d + lVar1;
      *pfVar10 = (float)dVar20;
    } while (iVar14 != 3);
    pbrt::Sphere::Bounds(&local_210,&local_1e8);
    lVar15 = local_248;
    in_ZMM7 = ZEXT464(0x3f7fffff);
    iVar14 = 0;
    local_278[2] = 0.0;
    local_278[1] = 0.0;
    local_278[0] = 0.0;
    do {
      uVar13 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
      bVar11 = (byte)(uVar12 >> 0x3b);
      auVar21 = vcvtusi2ss_avx512f(in_XMM9,uVar13 >> bVar11 | uVar13 << 0x20 - bVar11);
      auVar21 = vminss_avx(ZEXT416((uint)(auVar21._0_4_ * 2.3283064e-10)),in_ZMM7._0_16_);
      pfVar10 = (float *)((long)local_278 + 8);
      if (iVar14 != 0) {
        if (iVar14 == 1) {
          pfVar10 = (float *)((long)local_278 + 4);
        }
        else {
          pfVar10 = local_278;
        }
      }
      iVar14 = iVar14 + 1;
      *pfVar10 = auVar21._0_4_;
      uVar12 = uVar12 * 0x5851f42d4c957f2d + lVar1;
    } while (iVar14 != 3);
    auVar36._8_4_ = 0x3f800000;
    auVar36._0_8_ = 0x3f8000003f800000;
    auVar36._12_4_ = 0x3f800000;
    uVar13 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
    bVar11 = (byte)(uVar12 >> 0x3b);
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(local_278[0] *
                                            local_210.pMax.super_Tuple3<pbrt::Point3,_float>.z)),
                              ZEXT416((uint)(1.0 - local_278[0])),
                              ZEXT416((uint)local_210.pMin.super_Tuple3<pbrt::Point3,_float>.z));
    auVar26._8_8_ = 0;
    auVar26._0_4_ = local_210.pMin.super_Tuple3<pbrt::Point3,_float>.x;
    auVar26._4_4_ = local_210.pMin.super_Tuple3<pbrt::Point3,_float>.y;
    local_238.o.super_Tuple3<pbrt::Point3,_float>.x = local_264;
    local_238.o.super_Tuple3<pbrt::Point3,_float>.y = local_268;
    auVar21 = vinsertps_avx(ZEXT416((uint)local_278[2]),ZEXT416((uint)local_278[1]),0x10);
    auVar17 = vsubps_avx(auVar36,auVar21);
    auVar22._0_4_ = auVar21._0_4_ * local_210.pMax.super_Tuple3<pbrt::Point3,_float>.x;
    auVar22._4_4_ = auVar21._4_4_ * local_210.pMax.super_Tuple3<pbrt::Point3,_float>.y;
    auVar22._8_4_ = auVar21._8_4_ * 0.0;
    auVar22._12_4_ = auVar21._12_4_ * 0.0;
    auVar17 = vfmadd231ps_fma(auVar22,auVar26,auVar17);
    auVar21 = vinsertps_avx(ZEXT416((uint)local_264),ZEXT416((uint)local_268),0x10);
    auVar17 = vsubps_avx(auVar17,auVar21);
    local_238.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar19._0_4_ - local_278[3];
    local_238.o.super_Tuple3<pbrt::Point3,_float>.z = local_278[3];
    auVar21 = vcvtusi2ss_avx512f(in_XMM9,uVar13 >> bVar11 | uVar13 << 0x20 - bVar11);
    local_238.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar17);
    local_238.time = 0.0;
    local_238.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             )0;
    auVar21 = vminss_avx(ZEXT416((uint)(auVar21._0_4_ * 2.3283064e-10)),in_ZMM7._0_16_);
    if (auVar21._0_4_ < 0.5) {
      auVar28._0_4_ = auVar17._0_4_ * auVar17._0_4_;
      auVar28._4_4_ = auVar17._4_4_ * auVar17._4_4_;
      auVar28._8_4_ = auVar17._8_4_ * auVar17._8_4_;
      auVar28._12_4_ = auVar17._12_4_ * auVar17._12_4_;
      auVar21 = vmovshdup_avx(auVar28);
      auVar21 = vfmadd231ss_fma(auVar21,auVar17,auVar17);
      auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)local_238.d.super_Tuple3<pbrt::Vector3,_float>
                                                      .z),
                                ZEXT416((uint)local_238.d.super_Tuple3<pbrt::Vector3,_float>.z));
      auVar21 = vsqrtss_avx(auVar21,auVar21);
      fVar16 = auVar21._0_4_;
      auVar30._4_4_ = fVar16;
      auVar30._0_4_ = fVar16;
      auVar30._8_4_ = fVar16;
      auVar30._12_4_ = fVar16;
      local_238.d.super_Tuple3<pbrt::Vector3,_float>.z =
           local_238.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar16;
      auVar21 = vdivps_avx(auVar17,auVar30);
      local_238.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar21);
    }
    pbrt::Sphere::Intersect
              ((optional<pbrt::ShapeIntersection> *)&local_1b8.__align,&local_1e8,&local_238,
               INFINITY);
    if (local_b8 == '\x01') {
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_1b8._44_8_;
      auVar8._4_8_ = local_1b8._12_8_;
      auVar8._0_4_ = local_1b8._8_4_;
      auVar8._12_4_ = local_1b8._20_4_;
      auVar17 = vinsertps_avx(auVar8,ZEXT416((uint)local_1b8._20_4_),0x10);
      fVar3 = ((float)local_1b8._0_4_ + (float)local_1b8._4_4_) * 0.5;
      auVar35._0_4_ = (float)local_1b8._44_8_ * (float)local_1b8._44_8_;
      fVar16 = (float)((ulong)local_1b8._44_8_ >> 0x20);
      auVar35._4_4_ = fVar16 * fVar16;
      auVar35._8_8_ = 0;
      auVar21 = vmovshdup_avx(auVar35);
      auVar21 = ZEXT416((uint)((float)local_1b8._40_4_ * (float)local_1b8._40_4_ + auVar35._0_4_ +
                              auVar21._0_4_));
      auVar21 = vsqrtss_avx(auVar21,auVar21);
      auVar27._0_4_ = auVar21._0_4_;
      auVar23._0_4_ = (float)local_1b8._40_4_ / auVar27._0_4_;
      auVar23._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar27._4_4_ = auVar27._0_4_;
      auVar27._8_4_ = auVar27._0_4_;
      auVar27._12_4_ = auVar27._0_4_;
      auVar21 = vdivps_avx(auVar32,auVar27);
      auVar31._0_4_ = (float)local_1b8._12_8_ + auVar17._0_4_;
      auVar31._4_4_ = (float)((ulong)local_1b8._12_8_ >> 0x20) + auVar17._4_4_;
      auVar31._8_4_ = auVar17._8_4_ + 0.0;
      auVar31._12_4_ = auVar17._12_4_ + 0.0;
      auVar6._8_4_ = 0x3f000000;
      auVar6._0_8_ = 0x3f0000003f000000;
      auVar6._12_4_ = 0x3f000000;
      auVar18 = vmulps_avx512vl(auVar31,auVar6);
      auVar17 = vmovshdup_avx(auVar18);
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * auVar18._0_4_)),ZEXT416((uint)fVar3),
                                ZEXT416((uint)fVar3));
      auVar17 = vfmadd213ss_fma(auVar17,auVar17,auVar19);
      auVar17 = vsqrtss_avx(auVar17,auVar17);
      auVar33._0_4_ = auVar17._0_4_;
      auVar29._0_4_ = fVar3 / auVar33._0_4_;
      auVar29._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar33._4_4_ = auVar33._0_4_;
      auVar33._8_4_ = auVar33._0_4_;
      auVar33._12_4_ = auVar33._0_4_;
      auVar17 = vdivps_avx(auVar18,auVar33);
      auVar34._0_4_ = auVar21._0_4_ * auVar17._0_4_;
      auVar34._4_4_ = auVar21._4_4_ * auVar17._4_4_;
      auVar34._8_4_ = auVar21._8_4_ * auVar17._8_4_;
      auVar34._12_4_ = auVar21._12_4_ * auVar17._12_4_;
      auVar7._8_4_ = 0x80000000;
      auVar7._0_8_ = 0x8000000080000000;
      auVar7._12_4_ = 0x80000000;
      auVar19 = vxorps_avx512vl(auVar34,auVar7);
      auVar19 = vpermt2ps_avx512vl(auVar34,_DAT_00603510,auVar19);
      auVar21 = vfmadd231ps_fma(auVar19,auVar21,auVar17);
      auVar21 = vhaddps_avx(auVar21,auVar21);
      auVar21 = vfmadd231ss_fma(auVar21,auVar23,auVar29);
      testing::internal::CmpHelperFloatingPointEQ<float>(local_258,"1.","dot",1.0,auVar21._0_4_);
      if (local_258[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_260);
        message = "";
        if (local_250.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((local_250.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_240,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes_test.cpp"
                   ,0x185,message);
        testing::internal::AssertHelper::operator=(&local_240,(Message *)&local_260);
        testing::internal::AssertHelper::~AssertHelper(&local_240);
        if (((local_260.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar9 = testing::internal::IsTrue(true), bVar9)) &&
           (local_260.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_260.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_250,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 != 100);
  return;
}

Assistant:

TEST(ParialSphere, Normal) {
    for (int i = 0; i < 100; ++i) {
        RNG rng(i);
        Transform identity;
        Float radius = pExp(rng, 4);
        Float zMin = rng.Uniform<Float>() < 0.5
                         ? -radius
                         : Lerp(rng.Uniform<Float>(), -radius, radius);
        Float zMax = rng.Uniform<Float>() < 0.5
                         ? radius
                         : Lerp(rng.Uniform<Float>(), -radius, radius);
        Float phiMax = rng.Uniform<Float>() < 0.5 ? 360. : rng.Uniform<Float>() * 360.;
        Sphere sphere(&identity, &identity, false, radius, zMin, zMax, phiMax);

        // Ray origin
        Point3f o;
        for (int c = 0; c < 3; ++c)
            o[c] = pExp(rng);

        // Destination: a random point in the shape's bounding box.
        Bounds3f bbox = sphere.Bounds();
        Point3f t;
        for (int c = 0; c < 3; ++c)
            t[c] = rng.Uniform<Float>();
        Point3f p2 = bbox.Lerp(t);

        // Ray to intersect with the shape.
        Ray r(o, p2 - o);
        if (rng.Uniform<Float>() < .5)
            r.d = Normalize(r.d);

        // We should usually (but not always) find an intersection.
        auto si = sphere.Intersect(r, Infinity);
        if (!si)
            continue;

        Float dot = Dot(Normalize(si->intr.n), Normalize(Vector3f(si->intr.p())));
        EXPECT_FLOAT_EQ(1., dot);
    }
}